

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_filter.cpp
# Opt level: O2

string * __thiscall
duckdb::IsNullFilter::ToString
          (string *__return_storage_ptr__,IsNullFilter *this,string *column_name)

{
  ::std::operator+(__return_storage_ptr__,column_name," IS NULL");
  return __return_storage_ptr__;
}

Assistant:

string IsNullFilter::ToString(const string &column_name) const {
	return column_name + " IS NULL";
}